

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O0

void __thiscall
vmips::Ternary::Ternary
          (Ternary *this,shared_ptr<vmips::VirtReg> *lhs,shared_ptr<vmips::VirtReg> *op0,
          shared_ptr<vmips::VirtReg> *op1)

{
  shared_ptr<vmips::VirtReg> *op1_local;
  shared_ptr<vmips::VirtReg> *op0_local;
  shared_ptr<vmips::VirtReg> *lhs_local;
  Ternary *this_local;
  
  Instruction::Instruction(&this->super_Instruction);
  (this->super_Instruction)._vptr_Instruction = (_func_int **)&PTR_collect_register_001c0d90;
  std::shared_ptr<vmips::VirtReg>::shared_ptr(&this->lhs,lhs);
  std::shared_ptr<vmips::VirtReg>::shared_ptr(&this->op0,op0);
  std::shared_ptr<vmips::VirtReg>::shared_ptr(&this->op1,op1);
  return;
}

Assistant:

Ternary::Ternary(std::shared_ptr<VirtReg> lhs, std::shared_ptr<VirtReg> op0, std::shared_ptr<VirtReg> op1)
        : lhs(std::move(lhs)), op0(std::move(op0)), op1(std::move(op1)) {

}